

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::FuncType::~FuncType(FuncType *this)

{
  pointer pTVar1;
  pointer pcVar2;
  
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__FuncType_001838c8;
  pTVar1 = (this->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pTVar1 = (this->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_00183910;
  pcVar2 = (this->super_TypeEntry).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_TypeEntry).name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Func;
  }